

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiTableSettings * __thiscall
ImChunkStream<ImGuiTableSettings>::alloc_chunk(ImChunkStream<ImGuiTableSettings> *this,size_t sz)

{
  int iVar1;
  int iVar2;
  char *__src;
  char *__dest;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  iVar1 = (this->Buf).Size;
  uVar5 = (int)sz + 7U & 0xfffffffc;
  iVar3 = iVar1 + uVar5;
  iVar2 = (this->Buf).Capacity;
  if (iVar2 < iVar3) {
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    if (iVar4 <= iVar3) {
      iVar4 = iVar3;
    }
    if (iVar2 < iVar4) {
      __dest = (char *)ImGui::MemAlloc((long)iVar4);
      __src = (this->Buf).Data;
      if (__src != (char *)0x0) {
        memcpy(__dest,__src,(long)(this->Buf).Size);
        ImGui::MemFree((this->Buf).Data);
      }
      (this->Buf).Data = __dest;
      (this->Buf).Capacity = iVar4;
    }
  }
  (this->Buf).Size = iVar3;
  *(uint *)((this->Buf).Data + iVar1) = uVar5;
  return (ImGuiTableSettings *)((this->Buf).Data + (long)iVar1 + 4);
}

Assistant:

T*      alloc_chunk(size_t sz)      { size_t HDR_SZ = 4; sz = IM_MEMALIGN(HDR_SZ + sz, 4u); int off = Buf.Size; Buf.resize(off + (int)sz); ((int*)(void*)(Buf.Data + off))[0] = (int)sz; return (T*)(void*)(Buf.Data + off + (int)HDR_SZ); }